

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O0

void __thiscall
TPZCompElDisc::SolutionXInternal<double>(TPZCompElDisc *this,TPZVec<double> *x,TPZVec<double> *uh)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  TPZConnect *this_00;
  double *pdVar5;
  TPZVec<double> *in_RDX;
  TPZCompEl *in_RSI;
  long *in_RDI;
  int d;
  int iv;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  TPZFMatrix<double> dphix;
  TPZFMatrix<double> phix;
  int dim;
  int matsize;
  TPZFMatrix<double> *FineMeshSol;
  int nstate;
  TPZBlock *fineblock;
  TPZCompMesh *finemesh;
  undefined8 in_stack_fffffffffffffe08;
  double dVar6;
  TPZSolutionMatrix *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe58;
  int iVar7;
  undefined4 in_stack_fffffffffffffe5c;
  int iVar8;
  int64_t in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int iVar9;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  undefined1 local_168 [144];
  undefined8 local_d8;
  undefined1 local_d0 [144];
  undefined4 local_40;
  undefined4 local_3c;
  TPZFMatrix<double> *local_38;
  int local_2c;
  TPZBlock *local_28;
  TPZCompMesh *local_20;
  TPZVec<double> *local_18;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_18 = in_RDX;
  local_20 = TPZCompEl::Mesh(in_RSI);
  local_28 = TPZCompMesh::Block(local_20);
  plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
  local_2c = (**(code **)(*plVar4 + 0x78))();
  TPZCompMesh::Solution(local_20);
  local_38 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffffe10);
  local_3c = (**(code **)(*in_RDI + 600))();
  local_40 = (**(code **)(*in_RDI + 0xb0))();
  local_d8 = 0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,in_stack_fffffffffffffe60,
             (double *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,in_stack_fffffffffffffe60,
             (double *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  (**(code **)(*in_RDI + 0x330))(in_RDI,in_RSI,local_d0,local_168);
  this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,0);
  TPZConnect::SequenceNumber(this_00);
  iVar2 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffe10,iVar3);
  iVar9 = iVar2;
  iVar3 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffe10,iVar3);
  iVar8 = 0;
  TPZVec<double>::Fill
            ((TPZVec<double> *)(long)iVar3,(double *)(ulong)in_stack_fffffffffffffe58,0,
             (int64_t)in_RDI);
  for (iVar7 = 0; iVar7 < iVar9; iVar7 = iVar7 + 1) {
    in_stack_fffffffffffffe28 =
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)CONCAT44(iVar2,iVar3),(int64_t)in_stack_fffffffffffffe28,
                    (int64_t)in_stack_fffffffffffffe20);
    dVar1 = *in_stack_fffffffffffffe28;
    in_stack_fffffffffffffe20 =
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)CONCAT44(iVar2,iVar3),(int64_t)in_stack_fffffffffffffe28,
                    (int64_t)in_stack_fffffffffffffe20);
    dVar6 = *in_stack_fffffffffffffe20;
    pdVar5 = TPZVec<double>::operator[](local_18,(long)(iVar8 % local_2c));
    *pdVar5 = dVar1 * dVar6 + *pdVar5;
    iVar8 = iVar8 + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1ba745c);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1ba7469);
  return;
}

Assistant:

void TPZCompElDisc::SolutionXInternal(TPZVec<REAL> &x, TPZVec<TVar> &uh){
	TPZCompMesh *finemesh = Mesh();
	TPZBlock &fineblock = finemesh->Block();
	int nstate = Material()->NStateVariables();
	TPZFMatrix<TVar> &FineMeshSol = finemesh->Solution();
	int matsize = NShapeF(),dim = Dimension();
	TPZFMatrix<REAL> phix(matsize,1,0.);
	TPZFMatrix<REAL> dphix(dim,matsize,0.);
	ShapeX(x,phix,dphix);
	TPZConnect *df = &Connect(0);
	int64_t dfseq = df->SequenceNumber();
	int dfvar = fineblock.Size(dfseq);
	int64_t pos   = fineblock.Position(dfseq);
	int iv = 0,d;
	uh.Fill(0.);
	for(d=0; d<dfvar; d++) {
		uh[iv%nstate] += (TVar)phix(iv/nstate,0)*FineMeshSol(pos+d,0);
		iv++;
	}
}